

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O0

bool __thiscall gui::Slider::handleMouseMove(Slider *this,Vector2f *mouseParent)

{
  bool bVar1;
  Vector2f *in_RSI;
  Slider *in_RDI;
  Vector2f mouseLocal;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  float thumbPosition;
  Slider *this_00;
  bool local_1;
  
  this_00 = in_RDI;
  bVar1 = Widget::handleMouseMove(&in_RDI->super_Widget,in_RSI);
  thumbPosition = (float)((ulong)in_RSI >> 0x20);
  if (bVar1) {
    local_1 = true;
  }
  else {
    Widget::toLocalOriginSpace
              (&in_RDI->super_Widget,
               (Vector2f *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if ((in_RDI->isDragging_ & 1U) != 0) {
      bVar1 = sf::Mouse::isButtonPressed(Left);
      if (bVar1) {
        Widget::getOrigin((Widget *)0x1d6dd8);
        updateThumb(this_00,thumbPosition);
      }
      else {
        in_RDI->isDragging_ = false;
        Widget::requestRedraw
                  ((Widget *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      }
    }
    local_1 = (bool)(in_RDI->isDragging_ & 1);
  }
  return local_1;
}

Assistant:

bool Slider::handleMouseMove(const sf::Vector2f& mouseParent) {
    if (baseClass::handleMouseMove(mouseParent)) {
        return true;
    }
    const auto mouseLocal = toLocalOriginSpace(mouseParent);

    if (isDragging_) {
        if (sf::Mouse::isButtonPressed(sf::Mouse::Left)) {
            updateThumb(mouseLocal.x + getOrigin().x);
        } else {
            isDragging_ = false;
            requestRedraw();
        }
    }

    return isDragging_;
}